

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O2

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::LimitModifier::Deserialize(LimitModifier *this,Deserializer *deserializer)

{
  pointer pLVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LimitModifier_*,_false> local_18;
  
  local_18._M_head_impl = (LimitModifier *)operator_new(0x20);
  ((local_18._M_head_impl)->super_ResultModifier).type = LIMIT_MODIFIER;
  ((local_18._M_head_impl)->super_ResultModifier)._vptr_ResultModifier =
       (_func_int **)&PTR__LimitModifier_02793ee8;
  ((local_18._M_head_impl)->limit).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )0x0;
  ((local_18._M_head_impl)->offset).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       = (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )0x0;
  pLVar1 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>::
           operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                       *)&local_18);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,200,"limit",&pLVar1->limit);
  pLVar1 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>::
           operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                       *)&local_18);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xc9,"offset",&pLVar1->offset);
  (this->super_ResultModifier)._vptr_ResultModifier = (_func_int **)local_18._M_head_impl;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this;
}

Assistant:

unique_ptr<ResultModifier> LimitModifier::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LimitModifier>(new LimitModifier());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "limit", result->limit);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(201, "offset", result->offset);
	return std::move(result);
}